

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void math::wide_integer::uintwide_t<32768u,unsigned_int,void,false>::
     eval_multiply_n_by_n_to_2n<unsigned_int*,unsigned_int*,unsigned_int*>
               (uint *r,uint *a,uint *b,unsigned_fast_type count)

{
  uint uVar1;
  uint *last;
  ulong local_50;
  unsigned_fast_type j;
  uint *bj;
  uint *r_i_plus_j;
  local_double_limb_type carry;
  unsigned_fast_type i;
  unsigned_fast_type count_local;
  uint *b_local;
  uint *a_local;
  uint *r_local;
  
  i = count;
  count_local = (unsigned_fast_type)b;
  b_local = a;
  a_local = r;
  last = detail::advance_and_point<unsigned_int*,unsigned_int>(r,(uint)(count << 1));
  detail::fill_unsafe<unsigned_int*,unsigned_int>(r,last,0);
  for (carry = 0; carry < i; carry = carry + 1) {
    if (*b_local != 0) {
      r_i_plus_j = (uint *)0x0;
      bj = detail::advance_and_point<unsigned_int*,unsigned_long>(a_local,carry);
      j = count_local;
      for (local_50 = 0; local_50 < i; local_50 = local_50 + 1) {
        r_i_plus_j = (uint *)((long)r_i_plus_j + (ulong)*bj + (ulong)*b_local * (ulong)*(uint *)j);
        *bj = (uint)r_i_plus_j;
        uVar1 = detail::make_hi<unsigned_int,unsigned_long>((unsigned_long *)&r_i_plus_j);
        r_i_plus_j = (uint *)(ulong)uVar1;
        j = j + 4;
        bj = bj + 1;
      }
      *bj = (uint)r_i_plus_j;
    }
    b_local = b_local + 1;
  }
  return;
}

Assistant:

static constexpr auto eval_multiply_n_by_n_to_2n(      ResultIterator     r,
                                                           InputIteratorLeft  a,
                                                           InputIteratorRight b,
                                                     const unsigned_fast_type count) -> void
    {
      static_assert
      (
           (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type>::digits)
        && (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorRight>::value_type>::digits),
        "Error: Internals require same widths for left-right-result limb_types at the moment"
      );

      using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;

      using local_double_limb_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_limb_type>::digits * 2)>::exact_unsigned_type;

      detail::fill_unsafe(r, detail::advance_and_point(r, static_cast<size_t>(count * 2U)), static_cast<local_limb_type>(UINT8_C(0)));

      for(auto i = static_cast<unsigned_fast_type>(UINT8_C(0)); i < count; ++i)
      {
        if(*a != static_cast<local_limb_type>(UINT8_C(0)))
        {
          auto carry = static_cast<local_double_limb_type>(UINT8_C(0));

          auto r_i_plus_j = detail::advance_and_point(r, i); // NOLINT(llvm-qualified-auto,readability-qualified-auto)
          auto bj         = b;                               // NOLINT(llvm-qualified-auto,readability-qualified-auto)

          for(auto j = static_cast<unsigned_fast_type>(UINT8_C(0)); j < count; ++j)
          {
            carry =
              static_cast<local_double_limb_type>
              (
                  static_cast<local_double_limb_type>
                  (
                      carry
                    + static_cast<local_double_limb_type>(static_cast<local_double_limb_type>(*a) * *bj++)
                  )
                + *r_i_plus_j
              );

            *r_i_plus_j++ = static_cast<local_limb_type>(carry);
            carry         = detail::make_hi<local_limb_type>(carry);
          }

          *r_i_plus_j = static_cast<local_limb_type>(carry);
        }

        ++a;
      }
    }